

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_wString __thiscall ON_XMLNode::GetPathFromRoot(ON_XMLNode *this)

{
  ON_wString *src;
  ON_XMLNode *pNode;
  long *in_RSI;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNode *this_local;
  ON_wString *sPath;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,(mutex_type *)(in_RSI[1] + 0x40));
  src = (ON_wString *)(**(code **)(*in_RSI + 0x18))();
  ON_wString::ON_wString((ON_wString *)this,src);
  pNode = (ON_XMLNode *)(**(code **)(*in_RSI + 0x40))();
  PrependNodeToStringAndRecurseParents(pNode,(ON_wString *)this);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLNode::GetPathFromRoot(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_wString sPath = TagName();
  PrependNodeToStringAndRecurseParents(Parent(), sPath);

  return sPath;
}